

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createInstanceWithUnsupportedExtensionsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *platformInterface;
  TestLog *pTVar1;
  char *__s;
  VkInstance pVVar2;
  int iVar3;
  size_t sVar4;
  TestError *this;
  int ndx;
  long lVar5;
  VkInstance instance;
  VkInstanceCreateInfo instanceCreateInfo;
  char *enabledExtensions [2];
  InstanceDriver instanceIface;
  VkApplicationInfo appInfo;
  VkInstance local_250;
  undefined4 local_248 [2];
  undefined8 local_240;
  undefined4 local_238;
  undefined8 *local_230;
  undefined4 local_228;
  undefined8 local_220;
  undefined4 local_218;
  char **local_210;
  char *local_208 [3];
  undefined1 local_1f0 [8];
  DestroyInstanceFunc local_1e8;
  TestLog local_1e0 [13];
  ios_base local_178 [272];
  undefined8 local_68;
  undefined8 uStack_60;
  char *local_58;
  undefined8 uStack_50;
  char *local_48;
  undefined8 uStack_40;
  
  platformInterface = context->m_platformInterface;
  pTVar1 = context->m_testCtx->m_log;
  local_210 = local_208;
  local_208[0] = "VK_UNSUPPORTED_EXTENSION";
  local_208[1] = "THIS_IS_NOT_AN_EXTENSION";
  local_230 = &local_68;
  local_48 = "engineName";
  uStack_40 = 0x40000000000000;
  local_58 = "appName";
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_248[0] = 1;
  local_240 = 0;
  local_238 = 0;
  local_228 = 0;
  local_220 = 0;
  local_218 = 2;
  local_1f0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1e8,"Enabled extensions are: ",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
  std::ios_base::~ios_base(local_178);
  lVar5 = 0;
  do {
    local_1f0 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    __s = local_208[lVar5];
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1e8 + (int)*(undefined8 *)(local_1e8 + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,__s,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    std::ios_base::~ios_base(local_178);
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  local_250 = (VkInstance)0x0;
  iVar3 = (**platformInterface->_vptr_PlatformInterface)(platformInterface,local_248,0,&local_250);
  pVVar2 = local_250;
  if (local_250 != (VkInstance)0x0) {
    ::vk::InstanceDriver::InstanceDriver((InstanceDriver *)local_1f0,platformInterface,local_250);
    ::vk::InstanceDriver::destroyInstance
              ((InstanceDriver *)local_1f0,local_250,(VkAllocationCallbacks *)0x0);
    ::vk::InstanceDriver::~InstanceDriver((InstanceDriver *)local_1f0);
  }
  if (iVar3 == -7) {
    if (pVVar2 != (VkInstance)0x0) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,(char *)0x0,"!gotInstance",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                 ,0x15b);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_1f0 = (undefined1  [8])local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,
               "Pass, creating instance with unsupported extension was rejected.","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1f0,
               local_1e8 + (long)local_1f0);
  }
  else {
    local_1f0 = (undefined1  [8])local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"Fail, creating instance with unsupported extensions succeeded.",
               "");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1f0,
               local_1e8 + (long)local_1f0);
  }
  if (local_1f0 != (undefined1  [8])local_1e0) {
    operator_delete((void *)local_1f0,(ulong)((long)&(local_1e0[0].m_log)->flags + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createInstanceWithUnsupportedExtensionsTest (Context& context)
{
	tcu::TestLog&						log						= context.getTestContext().getLog();
	const PlatformInterface&			platformInterface		= context.getPlatformInterface();
	const char*							enabledExtensions[]		= {"VK_UNSUPPORTED_EXTENSION", "THIS_IS_NOT_AN_EXTENSION"};
	const VkApplicationInfo				appInfo					=
	{
		VK_STRUCTURE_TYPE_APPLICATION_INFO,						// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		"appName",												// const char*					pAppName;
		0u,														// deUint32						appVersion;
		"engineName",											// const char*					pEngineName;
		0u,														// deUint32						engineVersion;
		VK_API_VERSION,											// deUint32						apiVersion;
	};
	const VkInstanceCreateInfo			instanceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,					// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		(VkInstanceCreateFlags)0u,								// VkInstanceCreateFlags		flags;
		&appInfo,												// const VkApplicationInfo*		pAppInfo;
		0u,														// deUint32						layerCount;
		DE_NULL,												// const char*const*			ppEnabledLayernames;
		DE_LENGTH_OF_ARRAY(enabledExtensions),					// deUint32						extensionCount;
		enabledExtensions,										// const char*const*			ppEnabledExtensionNames;
	};

	log << TestLog::Message << "Enabled extensions are: " << TestLog::EndMessage;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(enabledExtensions); ndx++)
		log << TestLog::Message << enabledExtensions[ndx] <<  TestLog::EndMessage;

	{
		VkInstance		instance	= (VkInstance)0;
		const VkResult	result		= platformInterface.createInstance(&instanceCreateInfo, DE_NULL/*pAllocator*/, &instance);
		const bool		gotInstance	= !!instance;

		if (instance)
		{
			const InstanceDriver	instanceIface	(platformInterface, instance);
			instanceIface.destroyInstance(instance, DE_NULL/*pAllocator*/);
		}

		if (result == VK_ERROR_EXTENSION_NOT_PRESENT)
		{
			TCU_CHECK(!gotInstance);
			return tcu::TestStatus::pass("Pass, creating instance with unsupported extension was rejected.");
		}
		else
			return tcu::TestStatus::fail("Fail, creating instance with unsupported extensions succeeded.");
	}
}